

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O2

spawn_ret_t
depspawn::spawn<std::function<void(int&,int)>,int&,int&>
          (function<void_(int_&,_int)> *f,int *args,int *args_1)

{
  Workitem *ctx;
  Task *itask;
  int nargs;
  arg_info *pargs;
  int local_44;
  arg_info *local_40;
  reference_wrapper<int> local_38;
  reference_wrapper<int> local_30;
  
  local_40 = (arg_info *)0x0;
  local_44 = internal::
             fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                       (&local_40,args,args_1);
  if ((internal::TP == (TaskPool *)0x0) || (internal::TP->finish_ == true)) {
    internal::start_master();
  }
  ctx = LinkedListPool<depspawn::internal::Workitem,true,false>::
        malloc<depspawn::internal::arg_info*&,int_const&>
                  ((LinkedListPool<depspawn::internal::Workitem,true,false> *)
                   internal::Workitem::Pool,&local_40,&local_44);
  local_38._M_data = args_1;
  local_30._M_data = args;
  itask = internal::TaskPool::
          build_task<std::function<void(int&,int)>const&,std::reference_wrapper<int>,std::reference_wrapper<int>>
                    (internal::TP,ctx,f,&local_30,&local_38);
  internal::Workitem::insert_in_worklist(ctx,itask);
  return;
}

Assistant:

inline internal::spawn_ret_t spawn(const Function& f, Args&&... args) {
    using parameter_types = typename internal::ParameterTypes<Function>::type;

    internal::arg_info *pargs = nullptr;
    const int nargs = internal::fill_args<typename boost::mpl::begin<parameter_types>::type>(pargs, std::forward<Args>(args)...);

#ifdef DEPSPAWN_USE_TBB
    if(!internal::master_task)
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(new (tbb::task::allocate_additional_child_of(*internal::master_task)) internal::runner<decltype(std::bind(f, internal::ref<Args&&>::make(args)...))>(w, f, std::forward<Args>(args)...));
#else
    if(!internal::TP || !internal::TP->is_running())
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(internal::TP->build_task(w, f, internal::ref<Args&&>::make(args)...));
#endif
  }